

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref * __thiscall cashew::Value::operator[](Value *this,uint x)

{
  bool bVar1;
  Ref *pRVar2;
  uint x_local;
  Value *this_local;
  
  bVar1 = isArray(this);
  if (!bVar1) {
    __assert_fail("isArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x1ad,"Ref &cashew::Value::operator[](unsigned int)");
  }
  pRVar2 = ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::operator[]
                     (&((this->field_1).arr)->
                       super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>,(ulong)x);
  return pRVar2;
}

Assistant:

Ref& operator[](unsigned x) {
    assert(isArray());
    return (*arr)[x];
  }